

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O0

bool __thiscall
adios2::core::engine::BP4Reader::SleepOrQuit
          (BP4Reader *this,TimePoint *timeoutInstant,Seconds *pollSeconds)

{
  bool bVar1;
  duration<double,_std::ratio<1L,_1L>_> *in_RDI;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  __lhs;
  type __rhs;
  Seconds sleepTime;
  type remainderTime;
  TimePoint now;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffb8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffc0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffc8;
  undefined1 local_1;
  
  Now();
  __lhs = std::chrono::operator+
                    (in_stack_ffffffffffffffc8,
                     (duration<double,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffffc0);
  bVar1 = std::chrono::operator>=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (bVar1) {
    local_1 = false;
  }
  else {
    __rhs = std::chrono::operator-(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    bVar1 = std::chrono::operator<
                      ((duration<double,_std::ratio<1L,_1000000000L>_> *)__lhs.__d.__r,
                       (duration<double,_std::ratio<1L,_1L>_> *)__rhs.__r);
    if (bVar1) {
      std::chrono::duration<double,std::ratio<1l,1l>>::
      duration<double,std::ratio<1l,1000000000l>,void>
                ((duration<double,_std::ratio<1L,_1L>_> *)__lhs.__d.__r,
                 (duration<double,_std::ratio<1L,_1000000000L>_> *)__rhs.__r);
    }
    std::this_thread::sleep_for<double,std::ratio<1l,1l>>(in_RDI);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool BP4Reader::SleepOrQuit(const TimePoint &timeoutInstant, const Seconds &pollSeconds)
{
    auto now = Now();
    if (now + pollSeconds >= timeoutInstant)
    {
        return false;
    }
    auto remainderTime = timeoutInstant - now;
    auto sleepTime = pollSeconds;
    if (remainderTime < sleepTime)
    {
        sleepTime = remainderTime;
    }
    std::this_thread::sleep_for(sleepTime);
    return true;
}